

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::set_piece_deadline
          (torrent *this,piece_index_t piece,int t,deadline_flags_t flags)

{
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> _Var1;
  iterator __a;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  element_type *this_00;
  undefined4 extraout_var;
  error_category *cat;
  undefined4 extraout_var_00;
  pointer ptVar6;
  pointer ptVar7;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  __b;
  pointer ppVar8;
  reference pptVar9;
  peer_connection *local_280;
  bool local_259;
  bool local_249;
  bool local_219;
  piece_block local_208;
  peer_connection *local_200;
  peer_connection *peer;
  torrent_peer *tp;
  const_iterator end_1;
  const_iterator i_1;
  int block;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  downloaders;
  undefined1 local_1b8 [8];
  downloading_piece pi;
  bool filter_updated;
  bool was_finished;
  iterator iStack_198;
  download_priority_t prev_prio;
  const_iterator local_190;
  time_critical_piece *local_188;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_180;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_178;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  critical_piece_it;
  undefined1 local_160 [8];
  time_critical_piece p;
  bool filter_updated_1;
  bool was_finished_1;
  time_critical_piece *ptStack_120;
  download_priority_t prev_prio_1;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_100;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_f8;
  time_critical_piece *local_f0;
  time_critical_piece *local_e8;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_e0;
  time_critical_piece *local_d8;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_d0;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_c8;
  time_critical_piece *local_c0;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_b8;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  local_b0;
  iterator end;
  iterator i;
  undefined1 local_90 [8];
  shared_ptr<libtorrent::aux::torrent> self;
  bitfield_flag local_75;
  int local_74;
  duration<long,_std::ratio<1L,_1000L>_> local_70;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  duration local_60;
  time_point deadline;
  error_code local_48;
  undefined1 local_38 [19];
  bitfield_flag local_25;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_24;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_20;
  int local_1c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_18;
  int t_local;
  torrent *this_local;
  deadline_flags_t flags_local;
  piece_index_t piece_local;
  
  local_219 = true;
  local_1c = t;
  _Stack_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_local._3_1_ = flags.m_val;
  this_local._4_4_ = piece.m_val;
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    bVar2 = valid_metadata(this);
    local_219 = true;
    if (bVar2) {
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_20,0);
      bVar2 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                        ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                         ((long)&this_local + 4),&local_20);
      local_219 = true;
      if (!bVar2) {
        this_00 = ::std::
                  __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&(this->super_torrent_hot_members).m_torrent_file);
        local_24.m_val = (int)torrent_info::end_piece(this_00);
        local_219 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                              ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                               ((long)&this_local + 4),&local_24);
      }
    }
  }
  if (local_219 != false) {
    local_38[0x12] = this_local._3_1_;
    local_38[0x11] = '\x01';
    local_25 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::deadline_flags_tag,_void>)
                          this_local._3_1_,
                          (bitfield_flag<unsigned_char,_libtorrent::deadline_flags_tag,_void>)'\x01'
                         );
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_25);
    if (!bVar2) {
      return;
    }
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_38);
    cat = boost::system::generic_category();
    boost::system::error_code::error_code(&local_48,0x7d,cat);
    alert_manager::
    emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
              ((alert_manager *)CONCAT44(extraout_var,iVar5),(torrent_handle *)local_38,
               (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               ((long)&this_local + 4),&local_48);
    torrent_handle::~torrent_handle((torrent_handle *)local_38);
    return;
  }
  local_68.__d.__r = (duration)time_now();
  ::std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_70,&local_1c);
  local_60.__r = (rep)::std::chrono::operator+(&local_68,&local_70);
  bVar2 = is_seed(this);
  if (bVar2) {
LAB_00683e6b:
    local_75 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::deadline_flags_tag,_void>)
                          this_local._3_1_,
                          (bitfield_flag<unsigned_char,_libtorrent::deadline_flags_tag,_void>)'\x01'
                         );
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_75);
    if (bVar2) {
      self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = this_local._4_4_;
      read_piece(this,this_local._4_4_);
    }
  }
  else {
    bVar2 = has_picker(this);
    if (bVar2) {
      ppVar8 = ::std::
               unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ::operator->(&(this->super_torrent_hot_members).m_picker);
      local_74 = this_local._4_4_;
      bVar2 = piece_picker::has_piece_passed(ppVar8,this_local._4_4_);
      if (bVar2) goto LAB_00683e6b;
    }
    bVar2 = ::std::
            vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
            ::empty(&this->m_time_critical_pieces);
    if (bVar2) {
      ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                ((enable_shared_from_this<libtorrent::aux::torrent> *)local_90);
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[7])();
      ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
                ((shared_ptr<libtorrent::aux::torrent> *)&i,
                 (shared_ptr<libtorrent::aux::torrent> *)local_90);
      boost::asio::
      post<boost::asio::io_context,libtorrent::aux::torrent::set_piece_deadline(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::deadline_flags_tag,void>)::__0>
                ((io_context *)CONCAT44(extraout_var_00,iVar5),(type *)&i,(type *)0x0);
      set_piece_deadline(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::deadline_flags_tag,void>)
      ::$_0::~__0((__0 *)&i);
      ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                ((shared_ptr<libtorrent::aux::torrent> *)local_90);
    }
    end = ::std::
          vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
          ::begin(&this->m_time_critical_pieces);
    local_b0._M_current =
         (time_critical_piece *)
         ::std::
         vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
         ::end(&this->m_time_critical_pieces);
    while (bVar2 = __gnu_cxx::operator!=(&end,&local_b0), bVar2) {
      ptVar6 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
               ::operator->(&end);
      bVar2 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator!=
                        (&ptVar6->piece,
                         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                         ((long)&this_local + 4));
      if (!bVar2) {
        ptVar6 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                 ::operator->(&end);
        (ptVar6->deadline).__d.__r = local_60.__r;
        ptVar6 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                 ::operator->(&end);
        (ptVar6->flags).m_val = this_local._3_1_;
        while( true ) {
          local_c0 = end._M_current;
          local_b8 = ::std::
                     next<__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>>
                               (end._M_current,1);
          local_c8._M_current =
               (time_critical_piece *)
               ::std::
               vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
               ::end(&this->m_time_critical_pieces);
          bVar2 = __gnu_cxx::operator!=(&local_b8,&local_c8);
          local_249 = false;
          if (bVar2) {
            ptVar6 = __gnu_cxx::
                     __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                     ::operator->(&end);
            local_d8 = end._M_current;
            local_d0 = ::std::
                       next<__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>>
                                 (end._M_current,1);
            ptVar7 = __gnu_cxx::
                     __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                     ::operator->(&local_d0);
            local_249 = ::std::chrono::operator>(&ptVar6->deadline,&ptVar7->deadline);
          }
          if (local_249 == false) break;
          local_e0._M_current = end._M_current;
          local_f0 = end._M_current;
          local_e8 = (time_critical_piece *)
                     ::std::
                     next<__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>>
                               (end._M_current,1);
          ::std::
          iter_swap<__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>,__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>>
                    (local_e0,(__normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                               )local_e8);
          __gnu_cxx::
          __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
          ::operator++(&end);
        }
        while( true ) {
          local_f8._M_current =
               (time_critical_piece *)
               ::std::
               vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
               ::begin(&this->m_time_critical_pieces);
          bVar2 = __gnu_cxx::operator!=(&end,&local_f8);
          local_259 = false;
          if (bVar2) {
            ptVar6 = __gnu_cxx::
                     __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                     ::operator->(&end);
            local_100 = ::std::
                        prev<__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>>
                                  (end._M_current,1);
            ptVar7 = __gnu_cxx::
                     __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                     ::operator->(&local_100);
            local_259 = ::std::chrono::operator<(&ptVar6->deadline,&ptVar7->deadline);
          }
          __a._M_current = end._M_current;
          if (local_259 == false) break;
          ptStack_120 = end._M_current;
          __b = ::std::
                prev<__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>>
                          (end._M_current,1);
          ::std::
          iter_swap<__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>,__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>>
                    ((__normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                      )__a._M_current,__b);
          __gnu_cxx::
          __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
          ::operator--(&end);
        }
        ppVar8 = ::std::
                 unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ::operator->(&(this->super_torrent_hot_members).m_picker);
        was_finished_1 = (bool)piece_picker::piece_priority(ppVar8,this_local._4_4_);
        bVar2 = is_finished(this);
        ppVar8 = ::std::
                 unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ::operator->(&(this->super_torrent_hot_members).m_picker);
        p._39_1_ = 7;
        bVar3 = piece_picker::set_piece_priority(ppVar8,this_local._4_4_,(download_priority_t)0x7);
        bVar4 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator==
                          ((strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *
                           )&was_finished_1,
                           (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *
                           )&dont_download);
        if (!bVar4) {
          return;
        }
        update_gauge(this);
        if (!bVar3) {
          return;
        }
        update_peer_interest(this,bVar2);
        return;
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
      ::operator++(&end);
    }
    need_picker(this);
    time_critical_piece::time_critical_piece((time_critical_piece *)local_160);
    local_160 = (undefined1  [8])min_time();
    critical_piece_it._M_current = (time_critical_piece *)min_time();
    p.deadline.__d.__r._0_1_ = this_local._3_1_;
    p.last_requested.__d.__r = (duration)(duration)local_60.__r;
    p.deadline.__d.__r._4_4_ = 0;
    p._24_4_ = this_local._4_4_;
    p.first_requested = (time_point)critical_piece_it._M_current;
    local_180._M_current =
         (time_critical_piece *)
         ::std::
         vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
         ::begin(&this->m_time_critical_pieces);
    local_188 = (time_critical_piece *)
                ::std::
                vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                ::end(&this->m_time_critical_pieces);
    local_178 = ::std::
                upper_bound<__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>,libtorrent::aux::time_critical_piece>
                          (local_180,
                           (__normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                            )local_188,(time_critical_piece *)local_160);
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::time_critical_piece_const*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>
    ::__normal_iterator<libtorrent::aux::time_critical_piece*>
              ((__normal_iterator<libtorrent::aux::time_critical_piece_const*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>
                *)&local_190,&local_178);
    iStack_198 = ::std::
                 vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                 ::insert(&this->m_time_critical_pieces,local_190,(value_type *)local_160);
    ppVar8 = ::std::
             unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ::operator->(&(this->super_torrent_hot_members).m_picker);
    was_finished = (bool)piece_picker::piece_priority(ppVar8,this_local._4_4_);
    bVar2 = is_finished(this);
    ppVar8 = ::std::
             unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ::operator->(&(this->super_torrent_hot_members).m_picker);
    pi._8_4_ = this_local._4_4_;
    pi._7_1_ = 7;
    bVar3 = piece_picker::set_piece_priority(ppVar8,this_local._4_4_,(download_priority_t)0x7);
    bVar4 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator==
                      ((strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                       &was_finished,
                       (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                       &dont_download);
    if ((bVar4) && (update_gauge(this), bVar3)) {
      update_peer_interest(this,bVar2);
    }
    piece_picker::downloading_piece::downloading_piece((downloading_piece *)local_1b8);
    ppVar8 = ::std::
             unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ::operator->(&(this->super_torrent_hot_members).m_picker);
    downloaders.
    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = this_local._4_4_;
    piece_picker::piece_info(ppVar8,this_local._4_4_,(downloading_piece *)local_1b8);
    if ((pi.index.m_val._2_2_ & 0x7fff) != 0) {
      ppVar8 = ::std::
               unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ::operator->(&(this->super_torrent_hot_members).m_picker);
      piece_picker::get_downloaders
                ((vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  *)&block,ppVar8,this_local._4_4_);
      i_1._M_current._0_4_ = 0;
      end_1 = ::std::
              vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ::begin((vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       *)&block);
      tp = (torrent_peer *)
           ::std::
           vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ::end((vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  *)&block);
      while (bVar2 = __gnu_cxx::operator!=
                               (&end_1,(__normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
                                        *)&tp), bVar2) {
        pptVar9 = __gnu_cxx::
                  __normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
                  ::operator*(&end_1);
        peer = (peer_connection *)*pptVar9;
        if ((peer != (peer_connection *)0x0) &&
           ((_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
            (peer->super_peer_connection_hot_members).m_have_piece.super_bitfield.m_buf.
            super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t !=
            (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0)) {
          _Var1._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
          super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
               (peer->super_peer_connection_hot_members).m_have_piece.super_bitfield.m_buf.
               super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t;
          if ((_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
              _Var1._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
            local_280 = (peer_connection *)0x0;
          }
          else {
            local_280 = (peer_connection *)
                        ((long)_Var1._M_t.
                               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                               .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + -0x80);
          }
          local_200 = local_280;
          piece_block::piece_block(&local_208,this_local._4_4_,(int)i_1._M_current);
          peer_connection::make_time_critical(local_280,&local_208);
        }
        __gnu_cxx::
        __normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
        ::operator++(&end_1);
        i_1._M_current._0_4_ = (int)i_1._M_current + 1;
      }
      ::std::
      vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      ~vector((vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               *)&block);
    }
  }
  return;
}

Assistant:

void torrent::set_piece_deadline(piece_index_t const piece, int const t
		, deadline_flags_t const flags)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT_PRECOND(piece >= piece_index_t(0));
		TORRENT_ASSERT_PRECOND(valid_metadata());
		TORRENT_ASSERT_PRECOND(valid_metadata() && piece < m_torrent_file->end_piece());

		if (m_abort || !valid_metadata()
			|| piece < piece_index_t(0)
			|| piece >= m_torrent_file->end_piece())
		{
			// failed
			if (flags & torrent_handle::alert_when_available)
			{
				m_ses.alerts().emplace_alert<read_piece_alert>(
					get_handle(), piece, error_code(boost::system::errc::operation_canceled, generic_category()));
			}
			return;
		}

		time_point const deadline = aux::time_now() + milliseconds(t);

		// if we already have the piece, no need to set the deadline.
		// however, if the user asked to get the piece data back, we still
		// need to read it and post it back to the user
		if (is_seed() || (has_picker() && m_picker->has_piece_passed(piece)))
		{
			if (flags & torrent_handle::alert_when_available)
				read_piece(piece);
			return;
		}

		// if this is the first time critical piece we add. in order to make it
		// react quickly, cancel all the currently outstanding requests
		if (m_time_critical_pieces.empty())
		{
			// defer this by posting it to the end of the message queue.
			// this gives the client a chance to specify multiple time-critical
			// pieces before libtorrent cancels requests
			auto self = shared_from_this();
			post(m_ses.get_context(), [self] { self->wrap(&torrent::cancel_non_critical); });
		}

		for (auto i = m_time_critical_pieces.begin()
			, end(m_time_critical_pieces.end()); i != end; ++i)
		{
			if (i->piece != piece) continue;
			i->deadline = deadline;
			i->flags = flags;

			// resort i since deadline might have changed
			while (std::next(i) != m_time_critical_pieces.end() && i->deadline > std::next(i)->deadline)
			{
				std::iter_swap(i, std::next(i));
				++i;
			}
			while (i != m_time_critical_pieces.begin() && i->deadline < std::prev(i)->deadline)
			{
				std::iter_swap(i, std::prev(i));
				--i;
			}
			// just in case this piece had priority 0
			download_priority_t const prev_prio = m_picker->piece_priority(piece);
			bool const was_finished = is_finished();
			bool const filter_updated = m_picker->set_piece_priority(piece, top_priority);
			if (prev_prio == dont_download)
			{
				update_gauge();
				if (filter_updated) update_peer_interest(was_finished);
			}
			return;
		}

		need_picker();

		time_critical_piece p;
		p.first_requested = min_time();
		p.last_requested = min_time();
		p.flags = flags;
		p.deadline = deadline;
		p.peers = 0;
		p.piece = piece;
		auto const critical_piece_it = std::upper_bound(m_time_critical_pieces.begin()
			, m_time_critical_pieces.end(), p);
		m_time_critical_pieces.insert(critical_piece_it, p);

		// just in case this piece had priority 0
		download_priority_t const prev_prio = m_picker->piece_priority(piece);
		bool const was_finished = is_finished();
		bool const filter_updated = m_picker->set_piece_priority(piece, top_priority);
		if (prev_prio == dont_download)
		{
			update_gauge();
			if (filter_updated) update_peer_interest(was_finished);
		}

		piece_picker::downloading_piece pi;
		m_picker->piece_info(piece, pi);
		if (pi.requested == 0) return;
		// this means we have outstanding requests (or queued
		// up requests that haven't been sent yet). Promote them
		// to deadline pieces immediately
		std::vector<torrent_peer*> const downloaders
			= m_picker->get_downloaders(piece);

		int block = 0;
		for (auto i = downloaders.begin()
			, end(downloaders.end()); i != end; ++i, ++block)
		{
			torrent_peer* const tp = *i;
			if (tp == nullptr || tp->connection == nullptr) continue;
			auto* peer = static_cast<peer_connection*>(tp->connection);
			peer->make_time_critical(piece_block(piece, block));
		}
	}